

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O2

int EventFilter20to12(void *data,SDL_Event *event20)

{
  ushort uVar1;
  Sint32 SVar2;
  SDL_FingerID SVar3;
  uint uVar4;
  byte bVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  SDL12Key SVar8;
  int iVar9;
  char *pcVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  Uint32 UVar14;
  bool bVar15;
  float fVar16;
  undefined1 auVar17 [16];
  SDL_Rect SVar18;
  SDL12_Event local_120;
  float local_104;
  float local_100;
  int physical_h;
  float local_f8;
  SDL12_SysWMmsg msg;
  
  (*SDL20_memset)(&local_120,0,0x18);
  uVar7 = local_120.motion.x._1_1_;
  uVar6 = local_120.key.keysym.scancode;
  UVar14 = event20->type;
  switch(UVar14) {
  case 0x600:
    if (JoysticksAreGameControllers != SDL_FALSE) break;
LAB_00113d0d:
    local_120.key.keysym.scancode = uVar6;
    local_120.motion.x._1_1_ = uVar7;
    iVar9 = FindJoystick12IndexByInstanceId((event20->jaxis).which);
    uVar6 = local_120.key.keysym.scancode;
    uVar7 = local_120.motion.x._1_1_;
    if (iVar9 != -1) {
      local_120.active.gain = (char)iVar9;
      local_120.type = 7;
      local_120.active.state = (event20->display).event;
      local_120.key.keysym.scancode = (Uint8)(event20->jaxis).value;
      local_120.motion.x._1_1_ = (undefined1)((ushort)(event20->jaxis).value >> 8);
      uVar6 = local_120.key.keysym.scancode;
      uVar7 = local_120.motion.x._1_1_;
    }
    break;
  case 0x601:
    if ((JoysticksAreGameControllers == SDL_FALSE) &&
       (iVar9 = FindJoystick12IndexByInstanceId((event20->jaxis).which),
       uVar6 = local_120.key.keysym.scancode, uVar7 = local_120.motion.x._1_1_, iVar9 != -1)) {
      local_120.active.gain = (char)iVar9;
      local_120.type = 8;
      local_120.active.state = (event20->display).event;
      SVar2 = (event20->display).data1;
      local_120.key.keysym.scancode = (Uint8)SVar2;
      local_120.motion.x._1_1_ = (undefined1)((uint)SVar2 >> 8);
      local_120.motion.y = (Uint16)((uint)SVar2 >> 0x10);
      uVar6 = local_120.key.keysym.scancode;
      uVar7 = local_120.motion.x._1_1_;
    }
    break;
  case 0x602:
    if ((JoysticksAreGameControllers == SDL_FALSE) &&
       (iVar9 = FindJoystick12IndexByInstanceId((event20->jaxis).which),
       uVar6 = local_120.key.keysym.scancode, uVar7 = local_120.motion.x._1_1_, iVar9 != -1)) {
      local_120.active.gain = (char)iVar9;
      local_120.type = 9;
      local_120.active.state = (event20->display).event;
      local_120.button.state = (event20->display).padding1;
    }
    break;
  case 0x603:
  case 0x604:
    if (JoysticksAreGameControllers != SDL_FALSE) break;
LAB_00113b05:
    local_120.key.keysym.scancode = uVar6;
    local_120.motion.x._1_1_ = uVar7;
    iVar9 = FindJoystick12IndexByInstanceId((event20->jaxis).which);
    uVar6 = local_120.key.keysym.scancode;
    uVar7 = local_120.motion.x._1_1_;
    if (iVar9 != -1) {
      local_120.button.state = (event20->display).padding1;
      local_120._0_2_ = CONCAT11((char)iVar9,local_120.button.state == '\0') | 10;
      local_120.active.state = (event20->display).event;
    }
    break;
  default:
    local_120.key.keysym.scancode = (Uint8)MousePosition_0;
    local_120.motion.x._1_1_ = (undefined1)(MousePosition_0 >> 8);
    switch(UVar14) {
    case 0x400:
      if (VideoSurface12 == (SDL12_Surface *)0x0) {
        return 1;
      }
      if (VideoSurface12Location.surface20 == (SDL_Surface *)0x0) {
        return 1;
      }
      local_120.active.gain = (event20->display).event;
      local_120.type = 4;
      local_120.active.state = (event20->edit).text[4];
      AdjustOpenGLLogicalScalingPoint(&(event20->window).data2,(int *)((event20->edit).text + 0xc));
      iVar9 = VideoSurface12Location.w;
      if ((event20->window).data2 < VideoSurface12Location.w) {
        iVar9 = (event20->window).data2;
      }
      if (iVar9 < 1) {
        iVar9 = 0;
      }
      (event20->window).data2 = iVar9;
      iVar13 = VideoSurface12Location.h;
      if ((event20->motion).y < VideoSurface12Location.h) {
        iVar13 = (event20->motion).y;
      }
      if (iVar13 < 1) {
        iVar13 = 0;
      }
      (event20->motion).y = iVar13;
      local_120.key.keysym.scancode = (Uint8)iVar9;
      local_120.motion.x._1_1_ = (undefined1)((uint)iVar9 >> 8);
      local_120.motion.y = (Uint16)iVar13;
      if ((UseMouseRelativeScaling != SDL_FALSE) &&
         (VideoWindow20 != (SDL_Window *)0x0 && OpenGLLogicalScalingFBO != 0)) {
        (*SDL20_GetWindowSize)(VideoWindow20,(int *)&msg,&physical_h);
        SVar18 = GetOpenGLLogicalScalingViewport(msg._0_4_,physical_h);
        local_100 = (float)(event20->motion).xrel *
                    ((float)OpenGLLogicalScalingWidth / (float)SVar18.w) + MouseRelativeRemainder_0;
        local_104 = (float)(event20->motion).yrel *
                    ((float)OpenGLLogicalScalingHeight / (float)SVar18.h) + MouseRelativeRemainder_1
        ;
        local_f8 = SDL20_truncf(local_100);
        fVar16 = SDL20_truncf(local_104);
        MouseRelativeRemainder_0 = local_100 - local_f8;
        *(ulong *)((long)&(event20->user).data2 + 4) = CONCAT44((int)fVar16,(int)local_f8);
        MouseRelativeRemainder_1 = local_104 - fVar16;
      }
      iVar9 = (event20->motion).xrel;
      local_120.motion.xrel = (Sint16)iVar9;
      iVar13 = (event20->motion).yrel;
      local_120.motion.yrel = (Sint16)iVar13;
      if (MouseInputIsRelative == SDL_FALSE) {
        MousePosition_0 = (uint)CONCAT11(local_120.motion.x._1_1_,local_120.key.keysym.scancode);
        MousePosition_1 = (uint)local_120.motion.y;
        uVar6 = local_120.key.keysym.scancode;
        uVar7 = local_120.motion.x._1_1_;
      }
      else {
        bVar15 = SCARRY4(iVar9,MousePosition_0);
        MousePosition_0 = iVar9 + MousePosition_0;
        if (MousePosition_0 == 0 || bVar15 != (int)MousePosition_0 < 0) {
          MousePosition_0 = 0;
        }
        else if (VideoSurface12Location.w <= (int)MousePosition_0) {
          MousePosition_0 = VideoSurface12Location.w - 1;
        }
        local_120.key.keysym.scancode = (Uint8)MousePosition_0;
        local_120.motion.x._1_1_ = (undefined1)(MousePosition_0 >> 8);
        bVar15 = SCARRY4(iVar13,MousePosition_1);
        MousePosition_1 = iVar13 + MousePosition_1;
        if (MousePosition_1 == 0 || bVar15 != (int)MousePosition_1 < 0) {
          MousePosition_1 = 0;
        }
        else if (VideoSurface12Location.h <= (int)MousePosition_1) {
          MousePosition_1 = VideoSurface12Location.h - 1;
        }
        uVar6 = local_120.key.keysym.scancode;
        uVar7 = local_120.motion.x._1_1_;
        local_120.motion.y = (ushort)MousePosition_1;
      }
      goto switchD_00113db9_caseD_2;
    case 0x401:
      local_120.type = '\x05';
      break;
    case 0x402:
      local_120.type = '\x06';
      break;
    case 0x403:
      if ((event20->window).data2 != 0) {
        local_120.active.gain = (event20->display).event;
        local_120.type = '\x05';
        local_120.active.state = 0 < (event20->window).data2 ^ 5;
        local_120.button.state = '\x01';
        local_120.motion.y = (ushort)MousePosition_1;
        PushEventIfNotFiltered(&local_120);
        local_120.type = 6;
        local_120.button.state = '\0';
        uVar6 = local_120.key.keysym.scancode;
        uVar7 = local_120.motion.x._1_1_;
      }
      goto switchD_00113db9_caseD_2;
    default:
      if (UVar14 - 0x651 < 2) {
        if (JoysticksAreGameControllers == SDL_FALSE) goto switchD_00113db9_caseD_2;
        goto LAB_00113b05;
      }
      if (UVar14 == 0x650) {
        if (JoysticksAreGameControllers == SDL_FALSE) goto switchD_00113db9_caseD_2;
        goto LAB_00113d0d;
      }
      if (UVar14 != 0x200) {
        if (UVar14 == 0x201) {
          if (SupportSysWM == SDL_FALSE) {
            return 1;
          }
          msg.subsystem = SDL12_SYSWM_X11;
          local_120.key.keysym.scancode = uVar6;
          local_120.motion.x._1_1_ = uVar7;
          (*SDL20_memcpy)(&msg.event,&((event20->syswm).msg)->msg,0xc0);
          (*SDL20_memcpy)(&msg,&SDL_Linked_Version::version,3);
          local_120.type = 0xd;
          local_120.motion.xrel = (Sint16)&msg;
          local_120.motion.yrel = (Sint16)((ulong)&msg >> 0x10);
          local_120.key.keysym.mod = (uint)((ulong)&msg >> 0x20);
          uVar6 = local_120.key.keysym.scancode;
          uVar7 = local_120.motion.x._1_1_;
          goto switchD_00113db9_caseD_2;
        }
        if (UVar14 != 0x300) {
          if (UVar14 == 0x301) {
            if ((event20->display).padding1 != '\0') {
              return 1;
            }
            if (TranslateKeyboardLayout == SDL_FALSE) {
              local_120.motion.x._1_1_ = uVar7;
              SVar8 = Scancode20toKeysym12((event20->key).keysym.scancode);
            }
            else {
              local_120.motion.x._1_1_ = uVar7;
              SVar8 = Keysym20to12((event20->window).data2);
            }
            local_120.motion.xrel = (Sint16)SVar8;
            local_120.motion.yrel = (Sint16)(SVar8 >> 0x10);
            if ((KeyRepeatNextTicks != 0) && (KeyRepeatEvent.key.keysym.sym == SVar8)) {
              KeyRepeatNextTicks = 0;
            }
            local_120.active.state = (event20->display).event;
            KeyState[SVar8] = local_120.active.state;
            local_120._0_2_ = 3;
            local_120.key.keysym.scancode = Scancode20to12((event20->key).keysym.scancode);
            local_120.key.keysym.mod = (uint)(event20->key).keysym.mod;
            local_120.key.keysym.unicode = 0;
            FlushPendingKeydownEvent(0);
            uVar6 = local_120.key.keysym.scancode;
            uVar7 = local_120.motion.x._1_1_;
          }
          else {
            if (UVar14 == 0x303) {
              uVar12 = (uint)(event20->display).event;
              uVar4 = 0x1f;
              if (~(uVar12 << 0x18) != 0) {
                for (; ~(uVar12 << 0x18) >> uVar4 == 0; uVar4 = uVar4 - 1) {
                }
              }
              uVar4 = uVar4 ^ 0x1f;
              if ((event20->display).event == 0) {
                uVar4 = uVar12;
              }
              UVar14 = ~(-1 << (8U - (char)uVar4 & 0x1f)) & uVar12;
              for (lVar11 = 0xd; (int)lVar11 - 0xcU < uVar4; lVar11 = lVar11 + 1) {
                UVar14 = UVar14 << 6 | event20->padding[lVar11] & 0x3f;
              }
              goto LAB_00114001;
            }
            if (UVar14 != 0x100) {
              return 1;
            }
            local_120.type = 0xc;
          }
          goto switchD_00113db9_caseD_2;
        }
        FlushPendingKeydownEvent(0);
        if ((event20->display).padding1 != '\0') {
          return 1;
        }
        if (TranslateKeyboardLayout == SDL_FALSE) {
          SVar8 = Scancode20toKeysym12((event20->key).keysym.scancode);
        }
        else {
          SVar8 = Keysym20to12((event20->window).data2);
        }
        PendingKeydownEvent.active.state = (event20->display).event;
        PendingKeydownEvent.key.keysym.sym = SVar8;
        KeyState[SVar8] = PendingKeydownEvent.active.state;
        PendingKeydownEvent.type = event20->type == 0x300 ^ 3;
        PendingKeydownEvent.active.gain = '\0';
        PendingKeydownEvent.key.keysym.scancode = Scancode20to12((event20->key).keysym.scancode);
        uVar1 = (event20->key).keysym.mod;
        PendingKeydownEvent.key.keysym.mod = (uint)uVar1;
        PendingKeydownEvent.key.keysym.unicode = 0;
        if (EnabledUnicode == 0) {
LAB_00113ffa:
          UVar14 = 0;
        }
        else {
          if (SVar8 != SDLK12_KP_ENTER) {
            if (SVar8 == SDLK12_TAB) {
              UVar14 = 9;
              goto LAB_00114001;
            }
            if (SVar8 != SDLK12_RETURN) {
              if (SVar8 == SDLK12_ESCAPE) {
                UVar14 = 0x1b;
                goto LAB_00114001;
              }
              if (SVar8 == SDLK12_BACKSPACE) {
                UVar14 = 8;
                goto LAB_00114001;
              }
              if ((uVar1 & 0xc0) == 0) {
                PendingKeydownEvent.key.keysym.unicode = 0;
                return 1;
              }
              pcVar10 = SDL_GetKeyName(SVar8);
              UVar14 = (Uint32)*pcVar10;
              if ((UVar14 != 0) && (pcVar10[1] == '\0')) goto LAB_00114001;
              goto LAB_00113ffa;
            }
          }
          if ((uVar1 & 3) == 0) {
            UVar14 = 0xd;
          }
          else {
            UVar14 = 10;
          }
        }
LAB_00114001:
        FlushPendingKeydownEvent(UVar14);
        return 1;
      }
      if (VideoWindow20 == (SDL_Window *)0x0) goto switchD_00113db9_caseD_2;
      switch((event20->display).event) {
      case '\x01':
      case '\x03':
        if (SetVideoModeInProgress == '\0') {
          local_120.type = 0x11;
        }
        break;
      case '\x05':
        local_120.key.keysym.scancode = uVar6;
        local_120.motion.x._1_1_ = uVar7;
        UVar14 = (*SDL20_GetWindowFlags)(VideoWindow20);
        uVar6 = local_120.key.keysym.scancode;
        uVar7 = local_120.motion.x._1_1_;
        if ((~UVar14 & 0x1001) != 0) {
          local_120.type = 0x10;
          SVar3 = (event20->tfinger).fingerId;
          local_120.key.keysym.scancode = (Uint8)SVar3;
          local_120.motion.x._1_1_ = (undefined1)((ulong)SVar3 >> 8);
          local_120.motion.y = (Uint16)((ulong)SVar3 >> 0x10);
          local_120.motion.xrel = (Sint16)((ulong)SVar3 >> 0x20);
          local_120.motion.yrel = (Sint16)((ulong)SVar3 >> 0x30);
          uVar6 = local_120.key.keysym.scancode;
          uVar7 = local_120.motion.x._1_1_;
        }
        break;
      case '\a':
        local_120._0_2_ = 1;
        goto LAB_00113f9e;
      case '\t':
        local_120._0_2_ = 0x101;
LAB_00113f9e:
        local_120.active.state = 4;
        break;
      case '\n':
        local_120._0_2_ = 0x101;
        goto LAB_00113fba;
      case '\v':
        local_120._0_2_ = 1;
LAB_00113fba:
        local_120.active.state = 1;
        break;
      case '\f':
        local_120._0_2_ = 0x101;
        goto LAB_00113fac;
      case '\r':
        local_120._0_2_ = 1;
LAB_00113fac:
        local_120.active.state = 2;
      }
      goto switchD_00113db9_caseD_2;
    }
    local_120.active.gain = (event20->display).event;
    bVar5 = (byte)(event20->key).keysym.scancode;
    local_120.active.state = bVar5 + 2;
    if (bVar5 < 4) {
      local_120.active.state = bVar5;
    }
    local_120.button.state = (event20->edit).text[5];
    uVar6 = local_120.key.keysym.scancode;
    uVar7 = local_120.motion.x._1_1_;
    local_120.motion.y = (ushort)MousePosition_1;
    if (MouseInputIsRelative == SDL_FALSE) {
      AdjustOpenGLLogicalScalingPoint(&(event20->window).data2,(int *)((event20->edit).text + 0xc));
      auVar17._8_8_ = 0;
      auVar17._0_8_ = *(ulong *)((long)&(event20->tfinger).fingerId + 4);
      auVar17 = pshuflw(auVar17,auVar17,0xe8);
      local_120.key.keysym.scancode = auVar17[0];
      local_120.motion.x._1_1_ = auVar17[1];
      local_120.motion.y = auVar17._2_2_;
      uVar6 = local_120.key.keysym.scancode;
      uVar7 = local_120.motion.x._1_1_;
    }
  }
switchD_00113db9_caseD_2:
  local_120.motion.x._1_1_ = uVar7;
  local_120.key.keysym.scancode = uVar6;
  PushEventIfNotFiltered(&local_120);
  return 1;
}

Assistant:

static int SDLCALL
EventFilter20to12(void *data, SDL_Event *event20)
{
    SDL12_Event event12;
    SDL12_SysWMmsg msg;

    SDL_assert(data == NULL);  /* currently unused. */

    SDL20_zero(event12);

    switch (event20->type) {
        case SDL_QUIT:
            event12.type = SDL12_QUIT;
            break;

        case SDL_WINDOWEVENT:
            if (!VideoWindow20) {
                break;  /* no window? No event. */
            }

            switch (event20->window.event) {
                /* don't send an SDL12_QUIT event for SDL_WINDOWEVENT_CLOSE;
                   we only ever have a single window, so an SDL_QUIT will be
                   coming from SDL2 next anyhow, so just send that on. */

                case SDL_WINDOWEVENT_SHOWN:
                case SDL_WINDOWEVENT_EXPOSED:
                    /* drop these during window creation (see issue #229) */
                    if (!SetVideoModeInProgress) {
                        event12.type = SDL12_VIDEOEXPOSE;
                    }
                    break;

                case SDL_WINDOWEVENT_RESIZED: {
                    /* don't generate a VIDEORESIZE event based on SIZE_CHANGED
                       events: the recommended way to handle VIDEORESIZE is
                       with a new SDL_SetVideoMode() call, and creating a new
                       window generates a SIZE_CHANGED event, which leads to an
                       infinite loop. */

                    /* don't report VIDEORESIZE if we're fullscreen-desktop;
                       we're doing logical scaling and as far as the app is
                       concerned the window doesn't change. */
                    const Uint32 flags = SDL20_GetWindowFlags(VideoWindow20);
                    if ((flags & SDL_WINDOW_FULLSCREEN_DESKTOP) == SDL_WINDOW_FULLSCREEN_DESKTOP) {
                        break;
                    }

                    event12.type = SDL12_VIDEORESIZE;
                    event12.resize.w = event20->window.data1;
                    event12.resize.h = event20->window.data2;
                    break;
                }

                case SDL_WINDOWEVENT_MINIMIZED:
                    event12.type = SDL12_ACTIVEEVENT;
                    event12.active.gain = 0;
                    event12.active.state = SDL12_APPACTIVE;
                    break;

                case SDL_WINDOWEVENT_RESTORED:
                    event12.type = SDL12_ACTIVEEVENT;
                    event12.active.gain = 1;
                    event12.active.state = SDL12_APPACTIVE;
                    break;

                case SDL_WINDOWEVENT_ENTER:
                    event12.type = SDL12_ACTIVEEVENT;
                    event12.active.gain = 1;
                    event12.active.state = SDL12_APPMOUSEFOCUS;
                    break;

                case SDL_WINDOWEVENT_LEAVE:
                    event12.type = SDL12_ACTIVEEVENT;
                    event12.active.gain = 0;
                    event12.active.state = SDL12_APPMOUSEFOCUS;
                    break;

                case SDL_WINDOWEVENT_FOCUS_GAINED:
                    event12.type = SDL12_ACTIVEEVENT;
                    event12.active.gain = 1;
                    event12.active.state = SDL12_APPINPUTFOCUS;
                    break;

                case SDL_WINDOWEVENT_FOCUS_LOST:
                    event12.type = SDL12_ACTIVEEVENT;
                    event12.active.gain = 0;
                    event12.active.state = SDL12_APPINPUTFOCUS;
                    break;
            }
            break;

        case SDL_SYSWMEVENT:
            if (!SupportSysWM) {
                return 1;
            }

            #if defined(SDL_VIDEO_DRIVER_WINDOWS)
                SDL_assert(event20->syswm.msg->subsystem == SDL_SYSWM_WINDOWS);
                msg.hwnd = event20->syswm.msg->msg.win.hwnd;
                msg.msg = event20->syswm.msg->msg.win.msg;
                msg.wParam = event20->syswm.msg->msg.win.wParam;
                msg.lParam = event20->syswm.msg->msg.win.lParam;
            #elif defined(SDL_VIDEO_DRIVER_X11)
                SDL_assert(event20->syswm.msg->subsystem == SDL_SYSWM_X11);
                msg.subsystem = SDL12_SYSWM_X11;
                SDL20_memcpy(&msg.event.xevent, &event20->syswm.msg->msg.x11.event, sizeof (XEvent));
            #else
                SDL_assert(!"should have been caught by !SupportsSysWM test");
            #endif

            SDL20_memcpy(&msg.version, SDL_Linked_Version(), sizeof (msg.version));
            event12.type = SDL12_SYSWMEVENT;
            event12.syswm.msg = &msg;  /* this is stack-allocated, but we copy and update the pointer later. */
            break;

        case SDL_KEYUP:
            if (event20->key.repeat) {
                return 1;  /* ignore 2.0-style key repeat events */
            }

            if (TranslateKeyboardLayout) {
                event12.key.keysym.sym = Keysym20to12(event20->key.keysym.sym);
            } else {
                event12.key.keysym.sym = Scancode20toKeysym12(event20->key.keysym.scancode);
            }

            if (KeyRepeatNextTicks) {
                SDL_assert(KeyRepeatEvent.type == SDL12_KEYDOWN);
                if (KeyRepeatEvent.key.keysym.sym == event12.key.keysym.sym) {
                    KeyRepeatNextTicks = 0;
                }
            }

            KeyState[event12.key.keysym.sym] = event20->key.state;

            event12.type = SDL12_KEYUP;
            event12.key.which = 0;
            event12.key.state = event20->key.state;
            /* turns out that some apps actually made use of the hardware scancodes (checking for platform beforehand) */
            event12.key.keysym.scancode = Scancode20to12(event20->key.keysym.scancode);
            event12.key.keysym.mod = event20->key.keysym.mod;  /* these match up between 1.2 and 2.0! */
            event12.key.keysym.unicode = 0;

            /* If there's a pending KEYDOWN event, flush it on KEYUP. */
            FlushPendingKeydownEvent(0);
            break;

        case SDL_KEYDOWN:
            FlushPendingKeydownEvent(0);
            if (event20->key.repeat) {
                return 1;  /* ignore 2.0-style key repeat events */
            }

            if (TranslateKeyboardLayout) {
                PendingKeydownEvent.key.keysym.sym = Keysym20to12(event20->key.keysym.sym);
            } else {
                PendingKeydownEvent.key.keysym.sym = Scancode20toKeysym12(event20->key.keysym.scancode);
            }

            KeyState[PendingKeydownEvent.key.keysym.sym] = event20->key.state;

            PendingKeydownEvent.type = (event20->type == SDL_KEYDOWN) ? SDL12_KEYDOWN : SDL12_KEYUP;
            PendingKeydownEvent.key.which = 0;
            PendingKeydownEvent.key.state = event20->key.state;
            /* turns out that some apps actually made use of the hardware scancodes (checking for platform beforehand) */
            PendingKeydownEvent.key.keysym.scancode = Scancode20to12(event20->key.keysym.scancode);
            PendingKeydownEvent.key.keysym.mod = event20->key.keysym.mod;  /* these match up between 1.2 and 2.0! */
            PendingKeydownEvent.key.keysym.unicode = 0;

            /* If Unicode is not enabled, flush all KEYDOWN events immediately. */
            if (!EnabledUnicode) {
                FlushPendingKeydownEvent(0);
                return 1;
            }

            /* some programs rely on unicode values for these control characters */
            switch (PendingKeydownEvent.key.keysym.sym) {
                case SDLK12_BACKSPACE:
                    FlushPendingKeydownEvent('\b');
                    break;
                case SDLK12_TAB:
                    FlushPendingKeydownEvent('\t');
                    break;
                case SDLK12_RETURN:
                case SDLK12_KP_ENTER:
                    /* Enter: \r, Shift+Enter: \n */
                    if (PendingKeydownEvent.key.keysym.mod & KMOD_SHIFT)
                        FlushPendingKeydownEvent('\n');
                    else
                        FlushPendingKeydownEvent('\r');
                    break;
                case SDLK12_ESCAPE:
                    FlushPendingKeydownEvent(0x1B); /* '\e' */
                    break;
                default:
                    /* not a supported control character
                       when CTRL is pressed, text events aren't sent so use fallback for unicode */
                    if (PendingKeydownEvent.key.keysym.mod & KMOD_CTRL) {
                        const char *keyName = SDL_GetKeyName(PendingKeydownEvent.key.keysym.sym);
                        /* use key name as unicode if it's a single character */
                        if (keyName[0] && !keyName[1])
                            FlushPendingKeydownEvent(keyName[0]);
                        else
                            FlushPendingKeydownEvent(0);
                    }
                    break;
            }

            return 1;

        case SDL_TEXTEDITING: return 1;
        case SDL_TEXTINPUT: {
            char *text = event20->text.text;
            const int codePoint = DecodeUTF8Char(&text);
            FlushPendingKeydownEvent(codePoint);
            return 1;
        }

        case SDL_MOUSEMOTION:
            if (!VideoSurface12 || !VideoSurface12->surface20) {
                return 1;  /* we don't have a screen surface yet? Don't send this on to the app. */
            }

            event12.type = SDL12_MOUSEMOTION;
            event12.motion.which = (Uint8) event20->motion.which;
            event12.motion.state = event20->motion.state;
            AdjustOpenGLLogicalScalingPoint(&event20->motion.x, &event20->motion.y);
            /* Clamp the absolute position to the window dimensions. */
            event20->motion.x = SDL_max(SDL_min(event20->motion.x, VideoSurface12->w), 0);
            event20->motion.y = SDL_max(SDL_min(event20->motion.y, VideoSurface12->h), 0);
            event12.motion.x = (Uint16) event20->motion.x;
            event12.motion.y = (Uint16) event20->motion.y;
            if (UseMouseRelativeScaling) {
                AdjustOpenGLLogicalScalingVector(&event20->motion.xrel,
                                                 &event20->motion.yrel,
                                                 &MouseRelativeRemainder.x,
                                                 &MouseRelativeRemainder.y);
            }
            event12.motion.xrel = (Sint16) event20->motion.xrel;
            event12.motion.yrel = (Sint16) event20->motion.yrel;
            if (MouseInputIsRelative) {
                /* in relative mode, clamp fake absolute position to the window dimensions. */
                #define ADJUST_RELATIVE(axis, rel, dim) { \
                    MousePosition.axis += event20->motion.rel; \
                    if (MousePosition.axis <= 0) { \
                        MousePosition.axis = 0; \
                    } else if (MousePosition.axis >= VideoSurface12->dim) { \
                        MousePosition.axis = (VideoSurface12->dim - 1); \
                    } \
                    event12.motion.axis = MousePosition.axis; \
                }
                ADJUST_RELATIVE(x, xrel, w);
                ADJUST_RELATIVE(y, yrel, h);
                #undef ADJUST_RELATIVE
            } else {
                MousePosition.x = event12.motion.x;
                MousePosition.y = event12.motion.y;
            }
            break;

        case SDL_MOUSEBUTTONDOWN:
            event12.type = SDL12_MOUSEBUTTONDOWN;
            event12.button.which = (Uint8) event20->button.which;
            event12.button.button = event20->button.button;
            if (event12.button.button > 3) {
                event12.button.button += 2; /* SDL_BUTTON_X1/2 */
            }
            event12.button.state = event20->button.state;
            if (MouseInputIsRelative) {
                /* If we're using relative mouse input, we need to use our "fake" position. */
                event12.button.x = MousePosition.x;
                event12.button.y = MousePosition.y;
            } else {
                AdjustOpenGLLogicalScalingPoint(&event20->button.x, &event20->button.y);
                event12.button.x = (Uint16) event20->button.x;
                event12.button.y = (Uint16) event20->button.y;
            }
            break;

        case SDL_MOUSEBUTTONUP:
            event12.type = SDL12_MOUSEBUTTONUP;
            event12.button.which = (Uint8) event20->button.which;
            event12.button.button = event20->button.button;
            if (event12.button.button > 3) {
                event12.button.button += 2; /* SDL_BUTTON_X1/2 */
            }
            event12.button.state = event20->button.state;
            if (MouseInputIsRelative) {
                /* If we're using relative mouse input, we need to use our "fake" position. */
                event12.button.x = MousePosition.x;
                event12.button.y = MousePosition.y;
            } else {
                AdjustOpenGLLogicalScalingPoint(&event20->button.x, &event20->button.y);
                event12.button.x = (Uint16) event20->button.x;
                event12.button.y = (Uint16) event20->button.y;
            }
            break;

        case SDL_MOUSEWHEEL:
            if (event20->wheel.y == 0) {
                break;  /* don't support horizontal wheels in 1.2. */
            }
            event12.type = SDL12_MOUSEBUTTONDOWN;
            event12.button.which = (Uint8) event20->wheel.which;
            event12.button.button = (event20->wheel.y > 0) ? 4 : 5;  /* wheelup is 4, down is 5. */
            event12.button.state = SDL_PRESSED;
            event12.button.x = MousePosition.x;
            event12.button.y = MousePosition.y;
            PushEventIfNotFiltered(&event12);

            event12.type = SDL12_MOUSEBUTTONUP;  /* immediately release mouse "button" at the end of this switch. */
            event12.button.state = SDL_RELEASED;
            break;

        case SDL_JOYAXISMOTION:
            if (!JoysticksAreGameControllers) {
                const int which = FindJoystick12IndexByInstanceId(event20->jaxis.which);
                if (which != -1) {
                    event12.type = SDL12_JOYAXISMOTION;
                    event12.jaxis.which = (Uint8) which;
                    event12.jaxis.axis = event20->jaxis.axis;
                    event12.jaxis.value = event20->jaxis.value;
                }
            }
            break;

        case SDL_JOYBALLMOTION:
            if (!JoysticksAreGameControllers) {
                const int which = FindJoystick12IndexByInstanceId(event20->jball.which);
                if (which != -1) {
                    event12.type = SDL12_JOYBALLMOTION;
                    event12.jball.which = (Uint8) which;
                    event12.jball.ball = event20->jball.ball;
                    event12.jball.xrel = event20->jball.xrel;
                    event12.jball.yrel = event20->jball.yrel;
                }
            }
            break;

        case SDL_JOYHATMOTION:
            if (!JoysticksAreGameControllers) {
                const int which = FindJoystick12IndexByInstanceId(event20->jhat.which);
                if (which != -1) {
                    event12.type = SDL12_JOYHATMOTION;
                    event12.jhat.which = (Uint8) which;
                    event12.jhat.hat = event20->jhat.hat;
                    event12.jhat.value = event20->jhat.value;
                }
            }
            break;

        case SDL_JOYBUTTONDOWN:
        case SDL_JOYBUTTONUP:
            if (!JoysticksAreGameControllers) {
                const int which = FindJoystick12IndexByInstanceId(event20->jbutton.which);
                if (which != -1) {
                    event12.type = (event20->jbutton.state) ? SDL12_JOYBUTTONDOWN : SDL12_JOYBUTTONUP;
                    event12.jbutton.which = (Uint8) which;
                    event12.jbutton.button = event20->jbutton.button;
                    event12.jbutton.state = event20->jbutton.state;
                }
            }
            break;

        case SDL_CONTROLLERAXISMOTION:
            if (JoysticksAreGameControllers) {
                const int which = FindJoystick12IndexByInstanceId(event20->caxis.which);
                if (which != -1) {
                    event12.type = SDL12_JOYAXISMOTION;
                    event12.jaxis.which = (Uint8) which;
                    event12.jaxis.axis = event20->caxis.axis;
                    event12.jaxis.value = event20->caxis.value;
                }
            }
            break;

        case SDL_CONTROLLERBUTTONDOWN:
        case SDL_CONTROLLERBUTTONUP:
            if (JoysticksAreGameControllers) {
                const int which = FindJoystick12IndexByInstanceId(event20->cbutton.which);
                if (which != -1) {
                    event12.type = (event20->cbutton.state) ? SDL12_JOYBUTTONDOWN : SDL12_JOYBUTTONUP;
                    event12.jbutton.which = (Uint8) which;
                    event12.jbutton.button = event20->cbutton.button;
                    event12.jbutton.state = event20->cbutton.state;
                }
            }
            break;


        /*
        case SDL_JOYDEVICEADDED:
        case SDL_JOYDEVICEREMOVED:
        case SDL_CONTROLLERDEVICEADDED:
        case SDL_CONTROLLERDEVICEREMOVED:
        case SDL_CONTROLLERDEVICEREMAPPED:
        case SDL_FINGERDOWN:
        case SDL_FINGERUP:
        case SDL_FINGERMOTION:
        case SDL_DOLLARGESTURE:
        case SDL_DOLLARRECORD:
        case SDL_MULTIGESTURE:
        case SDL_CLIPBOARDUPDATE:
        case SDL_DROPFILE:
        */

        default:
            return 1;  /* drop everything else. */
    }

    PushEventIfNotFiltered(&event12);

    /* always pass it to the 2.0 event queue, as internal watchers (like the render API)
       might need to see these events to deal with logical scaling, etc. We've already
       copied it to the separate 1.2 event queue, and run the app's 1.2 event filter.
       Next time we call 1.2's SDL_PollEvent or SDL_PumpEvents(), we'll throw away the
       entire SDL2 event queue, as everything that cares about those will have then
       had a chance to examine it. */
    return 1;
}